

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

Error asmjit::CodeHolder_reserveInternal(CodeHolder *self,CodeBuffer *cb,size_t n)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  uint8_t *puVar5;
  Error EVar6;
  long lVar7;
  BaseAssembler *a;
  
  if ((cb->_data == (uint8_t *)0x0) || ((cb->_flags & 1) != 0)) {
    puVar5 = (uint8_t *)malloc(n);
  }
  else {
    puVar5 = (uint8_t *)realloc(cb->_data,n);
  }
  if (puVar5 == (uint8_t *)0x0) {
    EVar6 = 1;
  }
  else {
    cb->_data = puVar5;
    cb->_capacity = n;
    pvVar2 = (self->_emitters).super_ZoneVectorBase._data;
    uVar1 = (self->_emitters).super_ZoneVectorBase._size;
    EVar6 = 0;
    for (lVar7 = 0; (ulong)uVar1 << 3 != lVar7; lVar7 = lVar7 + 8) {
      lVar3 = *(long *)((long)pvVar2 + lVar7);
      if ((*(char *)(lVar3 + 8) == '\x01') && ((CodeBuffer *)(*(long *)(lVar3 + 0x50) + 0x48) == cb)
         ) {
        lVar4 = *(long *)(lVar3 + 0x58);
        *(uint8_t **)(lVar3 + 0x58) = puVar5;
        *(uint8_t **)(lVar3 + 0x60) = puVar5 + n;
        *(uint8_t **)(lVar3 + 0x68) = puVar5 + (*(long *)(lVar3 + 0x68) - lVar4);
      }
    }
  }
  return EVar6;
}

Assistant:

static Error CodeHolder_reserveInternal(CodeHolder* self, CodeBuffer* cb, size_t n) noexcept {
  uint8_t* oldData = cb->_data;
  uint8_t* newData;

  if (oldData && !cb->isExternal())
    newData = static_cast<uint8_t*>(::realloc(oldData, n));
  else
    newData = static_cast<uint8_t*>(::malloc(n));

  if (ASMJIT_UNLIKELY(!newData))
    return DebugUtils::errored(kErrorOutOfMemory);

  cb->_data = newData;
  cb->_capacity = n;

  // Update pointers used by assemblers, if attached.
  for (BaseEmitter* emitter : self->emitters()) {
    if (emitter->isAssembler()) {
      BaseAssembler* a = static_cast<BaseAssembler*>(emitter);
      if (&a->_section->_buffer == cb) {
        size_t offset = a->offset();

        a->_bufferData = newData;
        a->_bufferEnd  = newData + n;
        a->_bufferPtr  = newData + offset;
      }
    }
  }

  return kErrorOk;
}